

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContentSpecNode.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::ContentSpecNode::serialize(ContentSpecNode *this,XSerializeEngine *serEng)

{
  bool bVar1;
  XMLElementDecl *pXVar2;
  NodeTypes local_1c;
  XSerializeEngine *pXStack_18;
  int type;
  XSerializeEngine *serEng_local;
  ContentSpecNode *this_local;
  
  pXStack_18 = serEng;
  serEng_local = (XSerializeEngine *)this;
  bVar1 = XSerializeEngine::isStoring(serEng);
  if (bVar1) {
    operator<<(pXStack_18,&this->fElement->super_XSerializable);
    XMLElementDecl::storeElementDecl(pXStack_18,this->fElementDecl);
    operator<<(pXStack_18,&this->fFirst->super_XSerializable);
    operator<<(pXStack_18,&this->fSecond->super_XSerializable);
    XSerializeEngine::operator<<(pXStack_18,this->fType);
    XSerializeEngine::operator<<(pXStack_18,(bool)(this->fAdoptFirst & 1));
    XSerializeEngine::operator<<(pXStack_18,(bool)(this->fAdoptSecond & 1));
    XSerializeEngine::operator<<(pXStack_18,this->fMinOccurs);
    XSerializeEngine::operator<<(pXStack_18,this->fMaxOccurs);
  }
  else {
    xercesc_4_0::operator>>(pXStack_18,&this->fElement);
    pXVar2 = XMLElementDecl::loadElementDecl(pXStack_18);
    this->fElementDecl = pXVar2;
    xercesc_4_0::operator>>(pXStack_18,&this->fFirst);
    xercesc_4_0::operator>>(pXStack_18,&this->fSecond);
    XSerializeEngine::operator>>(pXStack_18,&local_1c);
    this->fType = local_1c;
    XSerializeEngine::operator>>(pXStack_18,&this->fAdoptFirst);
    XSerializeEngine::operator>>(pXStack_18,&this->fAdoptSecond);
    XSerializeEngine::operator>>(pXStack_18,&this->fMinOccurs);
    XSerializeEngine::operator>>(pXStack_18,&this->fMaxOccurs);
  }
  return;
}

Assistant:

void ContentSpecNode::serialize(XSerializeEngine& serEng)
{
    /***
     *  Since fElement, fFirst, fSecond are NOT created by the default 
     *  constructor, we need to create them dynamically.
     ***/

    if (serEng.isStoring())
    {
        serEng<<fElement;
        XMLElementDecl::storeElementDecl(serEng, fElementDecl);
        serEng<<fFirst;
        serEng<<fSecond;

        serEng<<(int)fType;
        serEng<<fAdoptFirst;
        serEng<<fAdoptSecond;
        serEng<<fMinOccurs;
        serEng<<fMaxOccurs;
    }
    else
    {
        serEng>>fElement;
        fElementDecl = XMLElementDecl::loadElementDecl(serEng);
        serEng>>fFirst;
        serEng>>fSecond;

        int type;
        serEng>>type;
        fType = (NodeTypes)type;

        serEng>>fAdoptFirst;
        serEng>>fAdoptSecond;
        serEng>>fMinOccurs;
        serEng>>fMaxOccurs;
    }

}